

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall GlobOpt::DoTrackCopiedValueForKills(GlobOpt *this,Value *value)

{
  ValueType *this_00;
  ValueInfo *valueInfo;
  code *pcVar1;
  Value *pVVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  ArrayValueInfo *pAVar6;
  Value *local_48;
  Value *local_40;
  Value *value_local;
  
  local_40 = value;
  if (value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32a3,"(value)","value");
    if (!bVar3) goto LAB_004662ff;
    *puVar5 = 0;
  }
  valueInfo = value->valueInfo;
  this_00 = &valueInfo->super_ValueType;
  value_local = (Value *)this;
  bVar3 = ValueType::IsAnyOptimizedArray(this_00);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32a6,"(valueInfo->IsAnyOptimizedArray())",
                       "valueInfo->IsAnyOptimizedArray()");
    if (!bVar3) goto LAB_004662ff;
    *puVar5 = 0;
  }
  bVar3 = ValueType::IsArrayOrObjectWithArray(this_00);
  bVar4 = ValueType::IsOptimizedTypedArray(this_00);
  if (bVar3 == bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32a9,"(!isJsArray == valueInfo->IsOptimizedTypedArray())",
                       "!isJsArray == valueInfo->IsOptimizedTypedArray()");
    if (!bVar4) {
LAB_004662ff:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar4 = ValueType::IsOptimizedVirtualTypedArray(this_00);
  pVVar2 = value_local;
  VerifyArrayValueInfoForTracking
            ((GlobOpt *)value_local,valueInfo,bVar3,(BasicBlock *)value_local[0xb].valueInfo,false);
  if (!bVar4 && !bVar3) {
    bVar3 = ValueInfo::IsArrayValueInfo(valueInfo);
    if (!bVar3) {
      return;
    }
    pAVar6 = ValueInfo::AsArrayValueInfo(valueInfo);
    if (pAVar6->headSegmentLengthSym == (StackSym *)0x0) {
      return;
    }
  }
  local_48 = value;
  JsUtil::
  BaseDictionary<Value*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<Value*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)0>
            (*(BaseDictionary<Value*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
               **)&pVVar2[0xb].valueInfo[0xd].super_ValueType,&local_48,&local_40);
  return;
}

Assistant:

void
GlobOpt::DoTrackCopiedValueForKills(Value *const value)
{
    Assert(value);

    ValueInfo *const valueInfo = value->GetValueInfo();
    Assert(valueInfo->IsAnyOptimizedArray());

    const bool isJsArray = valueInfo->IsArrayOrObjectWithArray();
    Assert(!isJsArray == valueInfo->IsOptimizedTypedArray());

    const bool isVirtualTypedArray = valueInfo->IsOptimizedVirtualTypedArray();

#if DBG
    VerifyArrayValueInfoForTracking(valueInfo, isJsArray, currentBlock);
#endif

    if(!isJsArray && !isVirtualTypedArray && !(valueInfo->IsArrayValueInfo() && valueInfo->AsArrayValueInfo()->HeadSegmentLengthSym()))
    {
        return;
    }

    // Can't assume going forward that it will definitely be an array without disabling implicit calls, because the
    // array may be transformed into an ES5 array. Since array opts are enabled, implicit calls can be disabled, and we can
    // treat it as a definite value type going forward, but the value needs to be tracked so that something like a call can
    // revert the value type to a likely version.
    CurrentBlockData()->valuesToKillOnCalls->Add(value);
}